

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::udf_avg_state_t<int>,int,duckdb::UDFAverageFunction>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  idx_t iVar11;
  long lVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar4 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar2 = *(long *)(input + 0x28);
      uVar6 = 0;
      uVar10 = 0;
      do {
        if (lVar2 == 0) {
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
LAB_002e8e4c:
          lVar12 = uVar7 - uVar10;
          uVar8 = uVar10;
          if (uVar10 <= uVar7 && lVar12 != 0) {
            iVar5 = *(int *)(state + 8);
            do {
              iVar5 = iVar5 + *(int *)(lVar4 + uVar10 * 4);
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
            *(int *)(state + 8) = iVar5;
            *(long *)state = lVar12 + *(long *)state;
            uVar8 = uVar7;
          }
        }
        else {
          uVar3 = *(ulong *)(lVar2 + uVar6 * 8);
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_002e8e4c;
          uVar8 = uVar7;
          if ((uVar3 != 0) && (uVar8 = uVar10, uVar10 < uVar7)) {
            uVar13 = 0;
            do {
              if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                *(int *)(state + 8) =
                     *(int *)(state + 8) + *(int *)(lVar4 + uVar10 * 4 + uVar13 * 4);
                *(long *)state = *(long *)state + 1;
              }
              uVar13 = uVar13 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar10 != uVar13);
          }
        }
        uVar6 = uVar6 + 1;
        uVar10 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      piVar1 = *(int **)(input + 0x20);
      *(idx_t *)state = *(long *)state + count;
      *(int *)(state + 8) = *(int *)(state + 8) + (int)count * *piVar1;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        iVar5 = *(int *)(state + 8);
        iVar9 = 0;
        do {
          iVar11 = iVar9;
          if (*local_68 != 0) {
            iVar11 = (idx_t)*(uint *)(*local_68 + iVar9 * 4);
          }
          iVar5 = iVar5 + *(int *)(local_60 + iVar11 * 4);
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
        *(int *)(state + 8) = iVar5;
        *(idx_t *)state = *(long *)state + count;
      }
    }
    else if (count != 0) {
      lVar4 = *local_68;
      iVar9 = 0;
      do {
        iVar11 = iVar9;
        if (lVar4 != 0) {
          iVar11 = (idx_t)*(uint *)(lVar4 + iVar9 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1) != 0) {
          *(int *)(state + 8) = *(int *)(state + 8) + *(int *)(local_60 + iVar11 * 4);
          *(long *)state = *(long *)state + 1;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}